

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,time_point now,
           time_point expire_time)

{
  pointer peVar1;
  _List_node_base *p_Var2;
  iterator iVar3;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar4;
  unsigned_long element_idx;
  uint in_stack_ffffffffffffffb8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  _List_node_base *local_38;
  
  local_40.__d.__r = expire_time.__d.__r;
  if ((ulong)((long)(this->m_elements).
                    super__Vector_base<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_elements).
                    super__Vector_base<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= this->m_used_size) {
    do_prune(this,now);
  }
  local_38 = (this->m_lru_end)._M_node[1]._M_next;
  pVar4 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long_const&,unsigned_long&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_keyed_elements,key,&local_38);
  iVar3 = std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
          ::
          _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,unsigned_long&>
                    ((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)&this->m_ttl_list,&local_40,(unsigned_long *)&local_38);
  peVar1 = (this->m_elements).
           super__Vector_base<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start + (long)local_38;
  std::__cxx11::string::operator=((string *)&peVar1->m_value,(string *)value);
  (peVar1->m_expire_time).__d.__r = (rep_conflict)local_40.__d.__r;
  (peVar1->m_lru_position)._M_node = (this->m_lru_end)._M_node;
  (peVar1->m_ttl_position)._M_node = iVar3._M_node;
  (peVar1->m_keyed_position).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (__node_type *)
       pVar4.first.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
       _M_cur.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>;
  p_Var2 = (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  (this->m_lru_end)._M_node = ((this->m_lru_end)._M_node)->_M_next;
  this->m_used_size = this->m_used_size + 1;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            (&this->m_lru_list,(int)p_Var2,(__off64_t *)&this->m_lru_list,
             (int)(peVar1->m_lru_position)._M_node,(__off64_t *)expire_time.__d.__r,in_R9,
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        // Inserts might require an item to be pruned, check that first before inserting the new key/value.
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }

        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        // Insert the element_idx into the TTL list.
        auto ttl_position = m_ttl_list.emplace(expire_time, element_idx);

        // Update the element's appropriate fields across the datastructures.
        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = ttl_position;
        e.m_keyed_position = keyed_position;

        // Update the LRU position.
        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }